

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_prod_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_prod_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar5;
  Amount AVar6;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *except;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  double fee_rate;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ConfidentialAssetId asset2;
  ConfidentialAssetId asset1;
  ElementsAddressFactory factory;
  ConfidentialAssetId *in_stack_ffffffffffffd1c8;
  AbstractTransactionController *this_00;
  UtxoData *in_stack_ffffffffffffd1d0;
  UtxoData *this_01;
  undefined4 in_stack_ffffffffffffd1d8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffd1dc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffd1e0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  string *in_stack_ffffffffffffd1f8;
  string *tx_hex;
  undefined4 in_stack_ffffffffffffd200;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffd204;
  undefined4 in_stack_ffffffffffffd208;
  undefined4 uVar9;
  NetType in_stack_ffffffffffffd20c;
  undefined4 uVar10;
  ElementsAddressFactory *in_stack_ffffffffffffd210;
  ConfidentialTransactionContext *this_03;
  undefined7 in_stack_ffffffffffffd240;
  undefined1 in_stack_ffffffffffffd247;
  UtxoData *in_stack_ffffffffffffd248;
  UtxoData *in_stack_ffffffffffffd250;
  ConfidentialAssetId *in_stack_ffffffffffffd278;
  ConfidentialTransactionContext *in_stack_ffffffffffffd280;
  undefined1 *local_2d40;
  AssertHelper local_2c90;
  Message local_2c88;
  undefined4 local_2c80;
  uint32_t local_2c7c;
  AssertionResult local_2c78;
  AssertHelper local_2c68;
  Message local_2c60;
  string local_2c58;
  AssertionResult local_2c38;
  AssertHelper local_2c28;
  Message local_2c20;
  int64_t local_2c18;
  int64_t local_2c10;
  undefined1 local_2c08;
  Amount local_2c00;
  int64_t local_2bf0;
  AssertionResult local_2be8 [3];
  string local_2bb0 [224];
  CoinSelectionOption *in_stack_ffffffffffffd530;
  string local_2ab8 [3];
  ElementsTransactionApi local_2a42 [2];
  ElementsUtxoAndOption *local_2a40;
  ElementsUtxoAndOption local_2a38;
  undefined1 local_1fe8 [1304];
  double in_stack_ffffffffffffe530;
  undefined1 in_stack_ffffffffffffe53f;
  ElementsUtxoAndOption *selected_txin_utxos_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *map_target_value_00;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe550;
  string *in_stack_ffffffffffffe558;
  ElementsTransactionApi *in_stack_ffffffffffffe560;
  allocator local_1a91;
  string local_1a90 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe580;
  ConfidentialAssetId *in_stack_ffffffffffffe588;
  Amount *in_stack_ffffffffffffe598;
  pointer in_stack_ffffffffffffe5a0;
  pointer in_stack_ffffffffffffe5a8;
  pointer in_stack_ffffffffffffe5b0;
  NetType_conflict in_stack_ffffffffffffe5b8;
  pointer in_stack_ffffffffffffe5c0;
  pointer in_stack_ffffffffffffe5c8;
  CoinSelectionOption local_1998;
  string local_1930;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1910;
  _Base_ptr local_18e8;
  undefined1 local_18e0;
  string local_18d8;
  _Base_ptr local_18b8;
  undefined1 local_18b0;
  string local_18a8;
  AbstractTransactionController local_1888 [3];
  _Base_ptr local_1858;
  undefined1 local_1850;
  Amount local_1848;
  string local_1838;
  _Base_ptr local_1818;
  undefined1 local_1810;
  Amount local_1808;
  string local_17f8 [2];
  undefined1 local_17a8 [56];
  undefined1 local_1770;
  allocator local_1761;
  string local_1760 [32];
  Address local_1740;
  allocator local_15b9;
  string local_15b8;
  Script local_1598;
  allocator local_1559;
  string local_1558;
  Txid local_1538;
  pointer local_1518;
  Txid local_14f0;
  undefined4 local_14d0;
  Script local_14c8 [2];
  Address local_1458;
  string local_12d8 [32];
  _func_int **local_12b8;
  undefined1 local_12b0;
  undefined4 local_12a8;
  pointer local_12a0;
  ConfidentialAssetId local_1298 [17];
  Amount local_ff0;
  allocator local_fd9;
  string local_fd8 [32];
  Address local_fb8;
  allocator local_e31;
  string local_e30;
  Script local_e10;
  allocator local_dd1;
  string local_dd0;
  Txid local_db0;
  undefined8 local_d90;
  Txid local_d68;
  undefined4 local_d48;
  Script local_d40 [2];
  Address local_cd0;
  string local_b50 [32];
  int64_t local_b30;
  undefined1 local_b28;
  undefined4 local_b20;
  undefined8 local_b18;
  ConfidentialAssetId local_b10 [17];
  Amount local_868;
  allocator local_851;
  string local_850 [32];
  Address local_830;
  allocator local_6a9;
  string local_6a8;
  Script local_688;
  allocator local_649;
  string local_648;
  Txid local_628;
  undefined8 local_608;
  Txid local_5e0;
  undefined4 local_5c0;
  Script local_5b8 [2];
  Address local_548;
  string local_3c8 [32];
  int64_t local_3a8;
  undefined1 local_3a0;
  undefined4 local_398;
  undefined8 local_390;
  ConfidentialAssetId local_388 [17];
  allocator local_d9;
  string local_d8;
  ConfidentialAssetId local_b8;
  allocator local_79;
  string local_78;
  ConfidentialAssetId local_58 [2];
  
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffd210,in_stack_ffffffffffffd20c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d",
             &local_79);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7",
             &local_d9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffd247,in_stack_ffffffffffffd240))
  ;
  local_608 = 0;
  local_390 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_648,"cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002"
             ,&local_649);
  cfd::core::Txid::Txid(&local_628,&local_648);
  cfd::core::Txid::operator=(&local_5e0,&local_628);
  cfd::core::Txid::~Txid((Txid *)0x2e3443);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  local_5c0 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6a8,"0014860d7bed1010c2ccb5247889daa5c58023fa9f8d",&local_6a9);
  cfd::core::Script::Script(&local_688,&local_6a8);
  cfd::core::Script::operator=(local_5b8,&local_688);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2",&local_851);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
             (string *)in_stack_ffffffffffffd1d0);
  cfd::core::Address::operator=(&local_548,&local_830);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::__cxx11::string::operator=
            (local_3c8,"wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)");
  cfd::core::Amount::Amount(&local_868,0xf4177);
  local_3a0 = local_868.ignore_check_;
  local_3a8 = local_868.amount_;
  local_398 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_388,local_58);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffd247,in_stack_ffffffffffffd240))
  ;
  local_d90 = 0;
  local_b18 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_dd0,"62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06"
             ,&local_dd1);
  cfd::core::Txid::Txid(&local_db0,&local_dd0);
  cfd::core::Txid::operator=(&local_d68,&local_db0);
  cfd::core::Txid::~Txid((Txid *)0x2e367f);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  local_d48 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e30,"0014891fd3ada0038759b124189ed64ab2343f7de0b1",&local_e31);
  cfd::core::Script::Script(&local_e10,&local_e30);
  cfd::core::Script::operator=(local_d40,&local_e10);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string((string *)&local_e30);
  std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd8,"ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9",&local_fd9);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
             (string *)in_stack_ffffffffffffd1d0);
  cfd::core::Address::operator=(&local_cd0,&local_fb8);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string(local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::__cxx11::string::operator=
            (local_b50,"wpkh(023004f49c61a63e339fa554e218774d6b4752bbfcfca61fe1c567b96af196b524)");
  cfd::core::Amount::Amount(&local_ff0,19999);
  local_b28 = local_ff0.ignore_check_;
  local_b30 = local_ff0.amount_;
  local_b20 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_b10,&local_b8);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffd247,in_stack_ffffffffffffd240))
  ;
  local_1518 = (pointer)0x0;
  local_12a0 = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1558,
             "376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988",&local_1559);
  cfd::core::Txid::Txid(&local_1538,&local_1558);
  cfd::core::Txid::operator=(&local_14f0,&local_1538);
  cfd::core::Txid::~Txid((Txid *)0x2e38bb);
  std::__cxx11::string::~string((string *)&local_1558);
  std::allocator<char>::~allocator((allocator<char> *)&local_1559);
  local_14d0 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_15b8,"001495f728a019f3ecc3725479b32b230de51df74d4a",&local_15b9);
  cfd::core::Script::Script(&local_1598,&local_15b8);
  cfd::core::Script::operator=(local_14c8,&local_1598);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string((string *)&local_15b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1760,"ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6",&local_1761);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
             (string *)in_stack_ffffffffffffd1d0);
  cfd::core::Address::operator=(&local_1458,&local_1740);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffd1d0);
  std::__cxx11::string::~string(local_1760);
  std::allocator<char>::~allocator((allocator<char> *)&local_1761);
  std::__cxx11::string::operator=
            (local_12d8,"wpkh(02272bcdbec1c0a2170e72f2d8cf42188d59ea7eae9296d60d435af3fe465d9bb5)");
  cfd::core::Amount::Amount((Amount *)(local_17a8 + 0x30),1);
  local_12b0 = local_1770;
  local_12b8 = (_func_int **)local_17a8._48_8_;
  local_12a8 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_1298,&local_b8);
  local_17a8._40_8_ = (_func_int **)0x3fbc28f5c28f5c29;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_17a8,local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2e3a98);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_17f8,local_58);
  cfd::core::Amount::Amount(&local_1808);
  pVar4 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffd1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
                     (Amount *)in_stack_ffffffffffffd1d0);
  local_1818 = (_Base_ptr)pVar4.first._M_node;
  local_1810 = pVar4.second;
  std::__cxx11::string::~string((string *)local_17f8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1838,&local_b8);
  cfd::core::Amount::Amount(&local_1848);
  pVar4 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffd1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
                     (Amount *)in_stack_ffffffffffffd1d0);
  local_1858 = (_Base_ptr)pVar4.first._M_node;
  local_1850 = pVar4.second;
  std::__cxx11::string::~string((string *)&local_1838);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2e3ba3);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_18a8,local_58);
  pVar5 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,char_const(&)[102]>
                    (in_stack_ffffffffffffd1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
                     (char (*) [102])in_stack_ffffffffffffd1d0);
  local_18b8 = (_Base_ptr)pVar5.first._M_node;
  local_18b0 = pVar5.second;
  std::__cxx11::string::~string((string *)&local_18a8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_18d8,&local_b8);
  pVar5 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,char_const(&)[102]>
                    (in_stack_ffffffffffffd1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd1dc,in_stack_ffffffffffffd1d8),
                     (char (*) [102])in_stack_ffffffffffffd1d0);
  local_18e8 = (_Base_ptr)pVar5.first._M_node;
  local_18e0 = pVar5.second;
  std::__cxx11::string::~string((string *)&local_18d8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2e3c8e);
  cfd::core::Amount::Amount((Amount *)&local_1910);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2e3caa);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffd1d0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffd530);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffd1d0,(double)in_stack_ffffffffffffd1c8);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffd1d0,(double)in_stack_ffffffffffffd1c8);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffd1d0,in_stack_ffffffffffffd1c8);
  cfd::CoinSelectionOption::SetBlindInfo(&local_1998,0,0x34);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange(&local_1998,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a90,
             "0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000"
             ,&local_1a91);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffd204,in_stack_ffffffffffffd200),in_stack_ffffffffffffd1f8
            );
  std::__cxx11::string::~string(local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
  local_2a40 = &local_2a38;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd250,in_stack_ffffffffffffd248);
  local_2a40 = (ElementsUtxoAndOption *)&local_2a38.is_issuance;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd250,in_stack_ffffffffffffd248);
  local_2a40 = (ElementsUtxoAndOption *)local_1fe8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd250,in_stack_ffffffffffffd248);
  selected_txin_utxos_00 = &local_2a38;
  map_target_value_00 =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
        *)0x3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2e3e2a);
  __l._M_array._4_4_ = in_stack_ffffffffffffd20c;
  __l._M_array._0_4_ = in_stack_ffffffffffffd208;
  __l._M_len = (size_type)in_stack_ffffffffffffd210;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffd204,in_stack_ffffffffffffd200),__l,
             (allocator_type *)in_stack_ffffffffffffd1f8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2e3e5e);
  local_2d40 = &stack0xffffffffffffe540;
  do {
    local_2d40 = local_2d40 + -0x528;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffd1d0);
  } while ((ElementsUtxoAndOption *)local_2d40 != &local_2a38);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(local_2a42);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_2ab8,(AbstractTransaction *)&stack0xffffffffffffe590);
  tx_hex = &local_1930;
  pcVar3 = (char *)((long)&local_1930.field_2 + 0xc);
  this_02 = &local_1910;
  this_01 = (UtxoData *)local_17a8;
  this_00 = local_1888;
  this_03 = (ConfidentialTransactionContext *)0x0;
  uVar9 = 0;
  uVar10 = 0;
  uVar8 = 3;
  uVar7 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550,
             map_target_value_00,
             (vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              *)selected_txin_utxos_00,in_stack_ffffffffffffe580,in_stack_ffffffffffffe588,
             (bool)in_stack_ffffffffffffe53f,in_stack_ffffffffffffe530,in_stack_ffffffffffffe598,
             (UtxoFilter *)in_stack_ffffffffffffe5a0,
             (CoinSelectionOption *)in_stack_ffffffffffffe5a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_ffffffffffffe5c0,(Amount *)in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string((string *)local_2ab8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_(this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffd204,uVar8),tx_hex);
  cfd::ConfidentialTransactionContext::operator=
            (this_03,(ConfidentialTransactionContext *)CONCAT44(uVar10,uVar9));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  std::__cxx11::string::~string(local_2bb0);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  AVar6 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    (in_stack_ffffffffffffd280,in_stack_ffffffffffffd278);
  local_2c10 = AVar6.amount_;
  local_2c08 = AVar6.ignore_check_;
  local_2c00.amount_ = local_2c10;
  local_2c00.ignore_check_ = (bool)local_2c08;
  local_2bf0 = cfd::core::Amount::GetSatoshiValue(&local_2c00);
  local_2c18 = cfd::core::Amount::GetSatoshiValue((Amount *)&local_1910);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar3,(char *)this_02,(long *)CONCAT44(in_stack_ffffffffffffd1dc,uVar7),
             (long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2be8);
  if (!bVar1) {
    testing::Message::Message(&local_2c20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2e4b13);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c28,&local_2c20);
    testing::internal::AssertHelper::~AssertHelper(&local_2c28);
    testing::Message::~Message((Message *)0x2e4b70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e4bc8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_2c58,(AbstractTransaction *)&stack0xffffffffffffe590);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2c38,"txc.GetHex().c_str()",
             "\"02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000\""
             ,pcVar2,
             "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000"
            );
  std::__cxx11::string::~string((string *)&local_2c58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c38);
  if (!bVar1) {
    testing::Message::Message(&local_2c60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2e4caf);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c68,&local_2c60);
    testing::internal::AssertHelper::~AssertHelper(&local_2c68);
    testing::Message::~Message((Message *)0x2e4d0c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e4d64);
  local_2c7c = cfd::core::ConfidentialTransaction::GetVsize
                         ((ConfidentialTransaction *)&stack0xffffffffffffe590);
  local_2c80 = 0x176;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar3,(char *)this_02,(uint *)CONCAT44(in_stack_ffffffffffffd1dc,uVar7),(int *)this_01
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c78);
  if (!bVar1) {
    testing::Message::Message(&local_2c88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2e4e23);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c90,&local_2c88);
    testing::internal::AssertHelper::~AssertHelper(&local_2c90);
    testing::Message::~Message((Message *)0x2e4e80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e4ed8);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2e4eff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2e4f26);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2e4f33);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e4f40);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e4f74);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e4f81);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2e4f8e);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_prod) {
  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);
  ConfidentialAssetId asset1("6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d");
  ConfidentialAssetId asset2("f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7");
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002");
  utxo1.vout = 2;
  utxo1.locking_script = Script("0014860d7bed1010c2ccb5247889daa5c58023fa9f8d");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2");
  utxo1.descriptor = "wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)";
  utxo1.amount = Amount(int64_t{999799});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = asset1;

  // Address2
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06");
  utxo2.vout = 0;
  utxo2.locking_script = Script("0014891fd3ada0038759b124189ed64ab2343f7de0b1");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9");
  utxo2.descriptor = "wpkh(023004f49c61a63e339fa554e218774d6b4752bbfcfca61fe1c567b96af196b524)";
  utxo2.amount = Amount(int64_t{19999});
  utxo2.address_type = AddressType::kP2wpkhAddress;
  utxo2.asset = asset2;

  // Address3
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988");
  utxo3.vout = 2;
  utxo3.locking_script = Script("001495f728a019f3ecc3725479b32b230de51df74d4a");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6");
  utxo3.descriptor = "wpkh(02272bcdbec1c0a2170e72f2d8cf42188d59ea7eae9296d60d435af3fe465d9bb5)";
  utxo3.amount = Amount(int64_t{1});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = asset2;

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = asset1;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(asset1.GetHex(), Amount());
  map_target_value.emplace(asset2.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(asset1.GetHex(), "lq1qqgv5wwfp4h0pfnyy2kkxl0kg3qnahcpfq7emrxu9xusz879axq0spg9cxu8wf72ktsft5r8vxnkfd8s5kmg32fvy8texp5p6s");
  reserve_txout_address.emplace(asset2.GetHex(), "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8");
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);
  option.SetKnapsackMinimumChange(0);

  ConfidentialTransactionContext txc("0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000");
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(txc.GetHex().c_str(), "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000");
  EXPECT_EQ(txc.GetVsize(), 374);
}